

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void jsonip::detail::stl_pushbackable_helper<std::vector<int,std::allocator<int>>>::
     write<jsonip::writer<true>>(writer<true> *w,vector<int,_std::allocator<int>_> *t)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  const_iterator it;
  vector<int,_std::allocator<int>_> *t_local;
  writer<true> *w_local;
  
  it._M_current = (int *)t;
  writer<true>::array_start(w);
  local_20._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(it._M_current);
  while( true ) {
    local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_20);
    arithmetic_helper<int>::write<jsonip::writer<true>>(w,*piVar2);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20);
  }
  writer<true>::array_end(w);
  return;
}

Assistant:

static void write(Writer& w, const T& t)
        {
            w.array_start();
            for (typename T::const_iterator it = t.begin(); it != t.end(); ++it)
            {
                slice_helper::type::write(w, *it);
            }
            w.array_end();
        }